

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpBase::PrintRelocation
          (BinaryReaderObjdumpBase *this,Reloc *reloc,Offset offset)

{
  char *pcVar1;
  string_view sVar2;
  string_view sVar3;
  
  if ((ulong)reloc->type < 0x1b) {
    pcVar1 = *(char **)(g_reloc_type_name + (ulong)reloc->type * 8);
  }
  else {
    pcVar1 = "<error_reloc_type>";
  }
  printf("           %06zx: %-18s %u",offset,pcVar1,(ulong)reloc->index);
  if (reloc->addend != 0) {
    printf(" + %d");
  }
  if (reloc->type != TypeIndexLEB) {
    sVar2 = GetSymbolName(this,reloc->index);
    sVar3 = GetSymbolName(this,reloc->index);
    printf(" <%.*s>",sVar2._M_len & 0xffffffff,sVar3._M_str);
  }
  putchar(10);
  return;
}

Assistant:

void BinaryReaderObjdumpBase::PrintRelocation(const Reloc& reloc,
                                              Offset offset) const {
  printf("           %06" PRIzx ": %-18s %" PRIindex, offset,
         GetRelocTypeName(reloc.type), reloc.index);
  if (reloc.addend) {
    printf(" + %d", reloc.addend);
  }
  if (reloc.type != RelocType::TypeIndexLEB) {
    printf(" <" PRIstringview ">",
           WABT_PRINTF_STRING_VIEW_ARG(GetSymbolName(reloc.index)));
  }
  printf("\n");
}